

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall node::anon_unknown_2::NodeImpl::isLoadingBlocks(NodeImpl *this)

{
  long lVar1;
  byte bVar2;
  ChainstateManager *pCVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = chainman(this);
  bVar2 = 1;
  if (((pCVar3->m_blockman).m_importing._M_base._M_i & 1U) == 0) {
    bVar2 = (pCVar3->m_blockman).m_blockfiles_indexed._M_base._M_i ^ 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool isLoadingBlocks() override { return chainman().m_blockman.LoadingBlocks(); }